

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::TriangleFans::Allocate(TriangleFans *this,long sizeTFAN,long verticesSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long *plVar4;
  long verticesSize_local;
  long sizeTFAN_local;
  TriangleFans *this_local;
  
  if (sizeTFAN < 1) {
    __assert_fail("sizeTFAN > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xc0,"O3DGCErrorCode o3dgc::TriangleFans::Allocate(long, long)");
  }
  if (0 < verticesSize) {
    this->m_numTFANs = 0;
    this->m_numVertices = 0;
    if (this->m_verticesAllocatedSize < verticesSize) {
      if (this->m_vertices != (long *)0x0) {
        operator_delete__(this->m_vertices);
      }
      this->m_verticesAllocatedSize = verticesSize;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->m_verticesAllocatedSize;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      plVar4 = (long *)operator_new__(uVar3);
      this->m_vertices = plVar4;
    }
    if (this->m_sizeTFANAllocatedSize < sizeTFAN) {
      if (this->m_sizeTFAN != (long *)0x0) {
        operator_delete__(this->m_sizeTFAN);
      }
      this->m_sizeTFANAllocatedSize = sizeTFAN;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->m_sizeTFANAllocatedSize;
      uVar3 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      plVar4 = (long *)operator_new__(uVar3);
      this->m_sizeTFAN = plVar4;
    }
    return O3DGC_OK;
  }
  __assert_fail("verticesSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xc1,"O3DGCErrorCode o3dgc::TriangleFans::Allocate(long, long)");
}

Assistant:

O3DGCErrorCode                Allocate(long sizeTFAN, long verticesSize)
                                    {
                                        assert(sizeTFAN     > 0);
                                        assert(verticesSize > 0);
                                        m_numTFANs    = 0;
                                        m_numVertices = 0;
                                        if (m_verticesAllocatedSize < verticesSize)
                                        {
                                            delete [] m_vertices;
                                            m_verticesAllocatedSize = verticesSize;
                                            m_vertices              = new long [m_verticesAllocatedSize];
                                        }
                                        if (m_sizeTFANAllocatedSize < sizeTFAN)
                                        {
                                            delete [] m_sizeTFAN;
                                            m_sizeTFANAllocatedSize = sizeTFAN;
                                            m_sizeTFAN              = new long [m_sizeTFANAllocatedSize];
                                        }
                                        return O3DGC_OK;
                                    }